

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::ChooseConfigCase::executeTest
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes,bool checkOrder)

{
  EGLDisplay *egl;
  ostringstream *poVar1;
  ostringstream *this_00;
  TestLog *pTVar2;
  EGLConfig config;
  ConfigAttribValueFmt CVar3;
  _anonymous_namespace_ *p_Var4;
  ChooseConfigCase *pCVar5;
  bool bVar6;
  deUint32 dVar7;
  EGLint EVar8;
  EGLint EVar9;
  char *__s;
  int iVar10;
  long lVar11;
  undefined7 in_register_00000011;
  int *__args;
  pointer ppVar12;
  ConfigAttribValueFmt *pCVar13;
  byte bVar14;
  vector<void_*,_std::allocator<void_*>_> *configs;
  bool bVar15;
  long lVar16;
  vector<int,_std::allocator<int>_> attribList;
  vector<void_*,_std::allocator<void_*>_> resultConfigs;
  string attribStr;
  vector<void_*,_std::allocator<void_*>_> referenceConfigs;
  EGLint numConfigs;
  vector<int,_std::allocator<int>_> local_248;
  vector<void_*,_std::allocator<void_*>_> local_228;
  _anonymous_namespace_ *local_210;
  undefined1 local_208 [40];
  size_t local_1e0;
  vector<void_*,_std::allocator<void_*>_> local_1d8;
  undefined4 local_1bc;
  ChooseConfigCase *local_1b8;
  undefined1 local_1b0 [24];
  _Rb_tree_const_iterator<void_*> local_198;
  size_t local_188;
  ios_base local_138 [264];
  
  local_1bc = (undefined4)CONCAT71(in_register_00000011,checkOrder);
  local_210 = (_anonymous_namespace_ *)
              EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  ppVar12 = (attributes->
            super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = this;
  if (ppVar12 !=
      (attributes->
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    __args = &ppVar12->second;
    do {
      local_1b0._0_4_ = ((pair<unsigned_int,_int> *)(__args + -1))->first;
      if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_248,
                   (iterator)
                   local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_1b0);
      }
      else {
        *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = ((pair<unsigned_int,_int> *)(__args + -1))->first;
        local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_248,
                   (iterator)
                   local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *__args;
        local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      ppVar12 = (pointer)(__args + 1);
      __args = __args + 2;
    } while (ppVar12 !=
             (attributes->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_1b0._0_4_ = 0x3038;
  if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_248,
               (iterator)
               local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_1b0);
  }
  else {
    *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0x3038;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Attributes:",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pCVar13 = (ConfigAttribValueFmt *)
            (attributes->
            super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar13 !=
      (ConfigAttribValueFmt *)
      (attributes->
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    this_00 = (ostringstream *)(local_1b0 + 8);
    do {
      iVar10 = pCVar13->value;
      CVar3 = *pCVar13;
      __s = eglu::getConfigAttribName(pCVar13->attribute);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,__s,(allocator<char> *)local_1b0);
      if (iVar10 == -1) {
        local_1b0._0_8_ = pTVar2;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(char *)local_208._0_8_,local_208._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": EGL_DONT_CARE",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = pTVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_208._0_8_,local_208._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
        local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CVar3;
        eglu::operator<<((ostream *)poVar1,(ConfigAttribValueFmt *)&local_228);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
      pCVar13 = pCVar13 + 1;
    } while (pCVar13 !=
             (ConfigAttribValueFmt *)
             (attributes->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar5 = local_1b8;
  p_Var4 = local_210;
  local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (void **)0x0;
  local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (void **)0x0;
  local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (void **)0x0;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  configs = (vector<void_*,_std::allocator<void_*>_> *)0x0;
  (*(*(_func_int ***)local_210)[2])
            (local_210,local_1b8->m_display,
             local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,0);
  dVar7 = (*(*(_func_int ***)p_Var4)[0x1f])(p_Var4);
  eglu::checkError(dVar7,"chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                   ,0xba);
  std::vector<void_*,_std::allocator<void_*>_>::resize(&local_228,(long)(int)local_1b0._0_4_);
  egl = &pCVar5->m_display;
  if (0 < (int)local_1b0._0_4_) {
    configs = (vector<void_*,_std::allocator<void_*>_> *)
              ((ulong)((long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
    (*(*(_func_int ***)p_Var4)[2])
              (p_Var4,*egl,
               local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start,configs,local_1b0);
    dVar7 = (*(*(_func_int ***)p_Var4)[0x1f])(p_Var4);
    eglu::checkError(dVar7,
                     "chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                     ,0xbe);
  }
  chooseConfigReference((Library *)p_Var4,*egl,&local_1d8,attributes);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expected:\n  ",0xc);
  egl::(anonymous_namespace)::configListToString_abi_cxx11_
            ((string *)local_208,local_210,(Library *)egl,(EGLDisplay *)&local_1d8,configs);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(char *)local_208._0_8_,local_208._8_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got:\n  ",7);
  egl::(anonymous_namespace)::configListToString_abi_cxx11_
            ((string *)local_208,local_210,(Library *)egl,(EGLDisplay *)&local_228,configs);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(char *)local_208._0_8_,local_208._8_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)local_1b0,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)local_208,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_188 == local_1e0) {
    bVar6 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<void*>,std::_Rb_tree_const_iterator<void*>>
                      (local_198,(_Base_ptr)(local_1b0 + 8),
                       (_Rb_tree_const_iterator<void_*>)local_208._24_8_);
  }
  else {
    bVar6 = false;
  }
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
               *)local_208);
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
               *)local_1b0);
  p_Var4 = local_210;
  if ((long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
    iVar10 = (int)((ulong)((long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    bVar15 = iVar10 < 1;
    if (0 < iVar10) {
      lVar16 = 0;
      do {
        config = *(void **)((long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar16 * 8);
        if (config != local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16]) {
          EVar8 = eglu::getConfigAttribInt((Library *)p_Var4,*egl,config,0x3027);
          EVar9 = eglu::getConfigAttribInt
                            ((Library *)p_Var4,*egl,
                             local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar16],0x3027);
          if ((EVar8 != 0x3051) || (EVar9 != 0x3051)) break;
        }
        lVar16 = lVar16 + 1;
        lVar11 = (long)(int)((ulong)((long)local_228.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_228.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3);
        bVar15 = lVar11 <= lVar16;
      } while (lVar16 < lVar11);
    }
  }
  else {
    bVar15 = false;
  }
  if (bVar6 == false) {
    bVar14 = 0;
  }
  else {
    bVar14 = (byte)local_1bc ^ 1 | bVar15;
  }
  if ((bVar14 & 1) == 0) {
    if (bVar6 == false) {
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Fail, configs don\'t match",0x19);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (bVar15) goto LAB_00e5b1e0;
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Fail, got correct configs but in invalid order",0x2e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Pass",4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
LAB_00e5b1e0:
  if ((bVar14 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  if (local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (void **)0x0) {
    operator_delete(local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((ConfigAttribValueFmt)
      local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (ConfigAttribValueFmt)0x0) {
    operator_delete(local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void executeTest (const std::vector<std::pair<EGLenum, EGLint> >& attributes, bool checkOrder)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		// Build attributes for EGL
		vector<EGLint> attribList;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
		{
			attribList.push_back(i->first);
			attribList.push_back(i->second);
		}
		attribList.push_back(EGL_NONE);

		// Print attribList to log
		log << TestLog::Message << "Attributes:" << TestLog::EndMessage;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
			logConfigAttrib(log, i->first, i->second);

		std::vector<EGLConfig>	resultConfigs;
		std::vector<EGLConfig>	referenceConfigs;

		// Query from EGL implementation
		{
			EGLint numConfigs = 0;
			EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs));
			resultConfigs.resize(numConfigs);

			if (numConfigs > 0)
				EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs));
		}

		// Build reference
		chooseConfigReference(egl, m_display, referenceConfigs, attributes);

		log << TestLog::Message << "Expected:\n  " << configListToString(egl, m_display, referenceConfigs) << TestLog::EndMessage;
		log << TestLog::Message << "Got:\n  " << configListToString(egl, m_display, resultConfigs) << TestLog::EndMessage;

		bool isSetMatch		= (set<EGLConfig>(resultConfigs.begin(), resultConfigs.end()) == set<EGLConfig>(referenceConfigs.begin(), referenceConfigs.end()));
		bool isExactMatch	= configListEqual(egl, m_display, resultConfigs, referenceConfigs);
		bool isMatch		= isSetMatch && (checkOrder ? isExactMatch : true);

		if (isMatch)
			log << TestLog::Message << "Pass" << TestLog::EndMessage;
		else if (!isSetMatch)
			log << TestLog::Message << "Fail, configs don't match" << TestLog::EndMessage;
		else if (!isExactMatch)
			log << TestLog::Message << "Fail, got correct configs but in invalid order" << TestLog::EndMessage;

		if (!isMatch)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}